

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int GmfSetBlock(int64_t MshIdx,int KwdCod,int64_t BegIdx,int64_t EndIdx,int MapTyp,void *MapTab,
               void *prc,...)

{
  __jmp_buf_tag *__env;
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong *puVar5;
  char in_AL;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  double *__ptr;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  uint *puVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int *piVar20;
  long *plVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  __jmp_buf_tag *p_Var25;
  double *pdVar26;
  FILE *__stream;
  int iVar27;
  long lVar28;
  double *pdVar29;
  double dVar30;
  uint uVar31;
  void *pvVar32;
  void *pvVar33;
  char *pcVar34;
  bool bVar35;
  undefined4 in_XMM0_Da;
  float fVar36;
  undefined4 uVar37;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 in_stack_00000010;
  va_list VarArg;
  aiocb local_7e78;
  ulong local_7e50;
  ulong local_7e48;
  ulong local_7e40;
  ulong local_7e38;
  ulong local_7e30;
  ulong local_7e28;
  double *local_7e20;
  double *local_7e18;
  ulong local_7e10;
  ulong local_7e08;
  ulong *local_7e00;
  long local_7df8;
  __jmp_buf_tag *local_7df0;
  uint local_7de8 [12];
  undefined4 local_7db8;
  undefined8 local_7da8;
  undefined8 local_7d98;
  undefined8 local_7d88;
  undefined8 local_7d78;
  undefined8 local_7d68;
  undefined8 local_7d58;
  undefined8 local_7d48;
  int UsrTyp [1000];
  char *UsrDat [1000];
  int FilTyp [1000];
  size_t UsrLen [1000];
  char *UsrBas [1000];
  
  iVar7 = (int)_KwdCod;
  if (in_AL != '\0') {
    local_7db8 = in_XMM0_Da;
    local_7da8 = in_XMM1_Qa;
    local_7d98 = in_XMM2_Qa;
    local_7d88 = in_XMM3_Qa;
    local_7d78 = in_XMM4_Qa;
    local_7d68 = in_XMM5_Qa;
    local_7d58 = in_XMM6_Qa;
    local_7d48 = in_XMM7_Qa;
  }
  __env = (__jmp_buf_tag *)(MshIdx + 0x48);
  p_Var25 = __env;
  iVar6 = _setjmp(__env);
  iVar27 = 0;
  if ((0xffffff0f < iVar7 - 0xf1U) && (iVar27 = 0, iVar6 == 0)) {
    lVar2 = MshIdx + (long)iVar7 * 0x3300;
    uVar4 = *(ulong *)(lVar2 + 0x10d8);
    iVar27 = 0;
    if ((uVar4 != 0) && ((*(uint *)(lVar2 + 0x110) & 0xfffffffe) == 2)) {
      if (MapTyp == 10) {
        pvVar32 = (void *)0x0;
        pvVar33 = MapTab;
      }
      else {
        pvVar33 = (void *)0x0;
        pvVar32 = MapTab;
        if (MapTyp != 0xb) {
          pvVar32 = pvVar33;
        }
      }
      VarArg[0].overflow_arg_area = &stack0x00000010;
      if (prc == (void *)0x0) {
        uVar8 = 0;
      }
      else {
        VarArg[0].overflow_arg_area = &stack0x00000018;
        uVar8 = in_stack_00000010;
      }
      if ((*(uint *)(lVar2 + 0x110) & 0xfffffffe) != 2) {
        iVar7 = -0x2a;
        goto LAB_0010d7a4;
      }
      local_7e00 = (ulong *)((long)VarArg[0].overflow_arg_area + 8);
      uVar16 = *VarArg[0].overflow_arg_area;
      local_7e08 = (ulong)uVar16;
      puVar5 = local_7e00;
      if (uVar16 == 100) {
        local_7e08 = *local_7e00;
        local_7e00 = *(ulong **)((long)VarArg[0].overflow_arg_area + 0x10);
        p_Var25 = *(__jmp_buf_tag **)((long)VarArg[0].overflow_arg_area + 0x18);
        _KwdCod = *(long *)((long)VarArg[0].overflow_arg_area + 0x20);
        puVar5 = (ulong *)((long)VarArg[0].overflow_arg_area + 0x28);
      }
      VarArg[0].overflow_arg_area = puVar5;
      uVar23 = 0x30;
      local_7e10 = uVar4 - 1;
      uVar3 = *(uint *)(lVar2 + 0x11c);
      iVar27 = 0;
      bVar35 = true;
      uVar31 = uVar16;
      uVar24 = uVar23;
      iVar7 = iVar27;
      while( true ) {
        uVar12 = (ulong)uVar24;
        uVar10 = (ulong)uVar23;
        if ((int)uVar3 <= iVar27) break;
        if (uVar16 == 100) {
          lVar9 = (long)iVar7;
          uVar31 = *(uint *)(local_7e08 + lVar9 * 4);
          if ((uVar31 & 0xfffffffc) == 0xc) {
            uVar31 = uVar31 - 4;
            iVar6 = *(int *)((long)local_7e00 + lVar9 * 4);
          }
          else if (uVar31 - 1 < 4) {
            iVar6 = *(int *)(MshIdx + 0x1c + (ulong)uVar31 * 4);
            uVar31 = *(int *)(MshIdx + 4) == 1 ^ 9;
          }
          else {
            iVar6 = 1;
          }
          lVar28 = p_Var25->__jmpbuf[lVar9];
          plVar21 = (long *)(_KwdCod + lVar9 * 8);
          iVar7 = iVar7 + 1;
        }
        else {
          if (!bVar35) {
            if (uVar23 < 0x29) {
              puVar14 = (uint *)((long)local_7de8 + uVar10);
              uVar12 = (ulong)(uVar23 + 8);
              uVar10 = (ulong)(uVar23 + 8);
            }
            else {
              puVar14 = (uint *)VarArg[0].overflow_arg_area;
              VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
            }
            uVar31 = *puVar14;
          }
          uVar23 = (uint)uVar10;
          if ((uVar31 & 0xfffffffc) == 0xc) {
            if (uVar23 < 0x29) {
              uVar23 = uVar23 + 8;
              uVar12 = (ulong)uVar23;
              piVar20 = (int *)((long)local_7de8 + uVar10);
            }
            else {
              piVar20 = (int *)VarArg[0].overflow_arg_area;
              VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
            }
            uVar31 = uVar31 - 4;
            iVar6 = *piVar20;
          }
          else if (uVar31 - 1 < 4) {
            iVar6 = *(int *)(MshIdx + 0x1c + (ulong)uVar31 * 4);
            uVar31 = *(int *)(MshIdx + 4) == 1 ^ 9;
          }
          else {
            iVar6 = 1;
          }
          if (uVar23 < 0x29) {
            uVar12 = (ulong)(uVar23 + 8);
            plVar21 = (long *)((long)local_7de8 + (ulong)uVar23);
          }
          else {
            plVar21 = (long *)VarArg[0].overflow_arg_area;
            VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
          }
          lVar28 = *plVar21;
          uVar23 = (uint)uVar12;
          if (uVar23 < 0x29) {
            uVar23 = uVar23 + 8;
            plVar21 = (long *)((long)local_7de8 + uVar12);
          }
          else {
            plVar21 = (long *)VarArg[0].overflow_arg_area;
            VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
          }
          bVar35 = false;
          uVar24 = uVar23;
        }
        if ((long)uVar4 < 2) {
          uVar10 = 0;
        }
        else {
          uVar10 = (ulong)(*plVar21 - lVar28) / local_7e10;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        for (lVar9 = 0; iVar19 = (int)lVar9, iVar6 != iVar19; lVar9 = lVar9 + 1) {
          UsrTyp[iVar27 + lVar9] = uVar31;
          pcVar34 = (char *)((long)iVar19 *
                             (long)*(int *)(&DAT_00110df0 + (long)(int)(uVar31 - 8) * 4) + lVar28);
          UsrBas[iVar27 + lVar9] = pcVar34;
          UsrDat[iVar27 + lVar9] = pcVar34;
          UsrLen[iVar27 + lVar9] = uVar10;
        }
        iVar27 = iVar27 + iVar19;
      }
      uVar15 = 0;
      uVar10 = uVar15;
      uVar12 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar12 = uVar15;
      }
      for (; uVar12 != uVar15; uVar15 = uVar15 + 1) {
        if (*(char *)(lVar2 + 0x10e8 + uVar15) == 'r') {
          bVar35 = *(int *)(MshIdx + 0x18) != 0x20;
          uVar22 = (ulong)bVar35;
          uVar16 = bVar35 + 8;
        }
        else {
          bVar35 = *(int *)(MshIdx + 4) < 4;
          uVar16 = bVar35 ^ 0xb;
          uVar22 = (ulong)bVar35 ^ 3;
        }
        FilTyp[uVar15] = uVar16;
        uVar10 = uVar10 + (long)*(int *)(&DAT_00110df0 + uVar22 * 4);
      }
      local_7df8 = _KwdCod;
      local_7df0 = p_Var25;
      if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
        __ptr = (double *)malloc(uVar10 * 10000);
        if (__ptr == (double *)0x0) {
          iVar7 = -0x2b;
LAB_0010d7a4:
          longjmp(__env,iVar7);
        }
        pdVar11 = (double *)malloc(uVar10 * 10000);
        if (pdVar11 == (double *)0x0) {
          iVar7 = -0x2c;
          goto LAB_0010d7a4;
        }
        local_7e78.aio_lio_opcode = 0;
        local_7e78._36_4_ = 0;
        local_7e78.aio_buf = (double *)0x0;
        local_7e78.aio_nbytes = 0;
        local_7e78.aio_fildes = *(FILE **)(MshIdx + 0x300410);
        local_7e20 = pdVar11;
        local_7e18 = pdVar11;
        local_7e78.aio_offset = GetFilPos((GmfMshSct *)MshIdx);
        local_7e28 = (long)uVar4 / 10000;
        local_7e30 = local_7e28 + 1;
        uVar12 = 0;
        uVar15 = uVar12;
        uVar13 = uVar12;
        pdVar11 = __ptr;
        local_7e38 = uVar10;
        for (uVar22 = uVar12; uVar22 <= local_7e30; uVar22 = uVar22 + 1) {
          uVar18 = uVar12;
          if (uVar22 != 0) {
            local_7e78.aio_nbytes = uVar13 * uVar10;
            local_7e50 = uVar12;
            iVar7 = my_aio_write(&local_7e78);
            uVar18 = local_7e50;
            uVar10 = local_7e38;
            if (iVar7 == -1) {
              printf("aio_fildes = %p\n",local_7e78.aio_fildes);
              printf("aio_buf    = %p\n",local_7e78.aio_buf);
              printf("aio_offset = %ld\n",local_7e78.aio_offset);
              printf("aio_nbytes = %ld\n",local_7e78.aio_nbytes);
              puVar14 = (uint *)__errno_location();
              printf("errno      = %d\n",(ulong)*puVar14);
              iVar7 = -0x2d;
              goto LAB_0010d7a4;
            }
          }
          if (local_7e28 < uVar22) {
LAB_0010d509:
            if (local_7e78.aio_lio_opcode != 0) {
              if (local_7e78.aio_lio_opcode == 0x73) {
                do {
                } while( true );
              }
              pcVar34 = strerror(local_7e78.aio_lio_opcode);
              printf(" Error at aio_error() : %s\n",pcVar34);
              iVar7 = -0x2e;
              goto LAB_0010d7a4;
            }
            local_7e78.aio_offset = local_7e78.aio_offset + local_7e78.aio_nbytes;
            uVar12 = uVar18;
          }
          else {
            uVar13 = uVar22 * -10000 + uVar4;
            if (uVar22 != local_7e28) {
              uVar13 = 10000;
            }
            uVar12 = uVar13 + uVar18;
            if (prc != (void *)0x0) {
              local_7e48 = uVar15;
              (*(code *)prc)(uVar18 + 1,uVar12,uVar8);
              uVar15 = local_7e48;
            }
            uVar17 = 0;
            pdVar26 = pdVar11;
            uVar18 = 0;
            if (0 < (long)uVar13) {
              uVar18 = uVar13;
            }
            for (; uVar17 != uVar18; uVar17 = uVar17 + 1) {
              uVar1 = uVar15 + 1;
              for (lVar28 = 0; lVar28 < *(int *)(lVar2 + 0x11c); lVar28 = lVar28 + 1) {
                if (pvVar33 == (void *)0x0) {
                  if (pvVar32 != (void *)0x0) {
                    lVar9 = *(long *)((long)pvVar32 + uVar1 * 8);
                    goto LAB_0010d41e;
                  }
                  lVar9 = UsrLen[lVar28] * uVar15;
                }
                else {
                  lVar9 = (long)*(int *)((long)pvVar33 + uVar1 * 4);
LAB_0010d41e:
                  lVar9 = (lVar9 + -1) * UsrLen[lVar28];
                }
                pdVar29 = (double *)(UsrBas[lVar28] + lVar9);
                UsrDat[lVar28] = (char *)pdVar29;
                switch(FilTyp[lVar28]) {
                case 8:
                  if (UsrTyp[lVar28] == 8) {
                    fVar36 = *(float *)pdVar29;
                  }
                  else {
                    fVar36 = (float)*pdVar29;
                  }
                  *(float *)pdVar26 = fVar36;
                  break;
                case 9:
                  if (UsrTyp[lVar28] == 9) {
                    dVar30 = *pdVar29;
                  }
                  else {
                    dVar30 = (double)*(float *)pdVar29;
                  }
                  *pdVar26 = dVar30;
                  break;
                case 10:
                  *(float *)pdVar26 = *(float *)pdVar29;
                  break;
                case 0xb:
                  if (UsrTyp[lVar28] == 0xb) {
                    dVar30 = *pdVar29;
                  }
                  else {
                    dVar30 = (double)(long)(int)*(float *)pdVar29;
                  }
                  *pdVar26 = dVar30;
                }
                pdVar26 = (double *)
                          ((long)pdVar26 +
                          (long)*(int *)("errno      = %d\n" + (long)FilTyp[lVar28] * 4 + 0xd));
              }
              uVar15 = uVar1;
            }
            uVar18 = uVar12;
            local_7e40 = uVar12;
            if (uVar22 != 0) goto LAB_0010d509;
          }
          bVar35 = pdVar11 == __ptr;
          pdVar11 = __ptr;
          local_7e78.aio_buf = local_7e20;
          if (bVar35) {
            pdVar11 = local_7e20;
            local_7e78.aio_buf = __ptr;
          }
        }
        SetFilPos((GmfMshSct *)MshIdx,local_7e78.aio_offset);
        free(__ptr);
        free(local_7e18);
      }
      else {
        if (prc != (void *)0x0) {
          (*(code *)prc)(1,*(undefined8 *)(lVar2 + 0x10d8),uVar8);
        }
        for (uVar10 = 1; uVar10 <= uVar4; uVar10 = uVar10 + 1) {
          for (lVar28 = 0; lVar28 < *(int *)(lVar2 + 0x11c); lVar28 = lVar28 + 1) {
            switch(UsrTyp[lVar28]) {
            case 8:
              __stream = *(FILE **)(MshIdx + 0x300410);
              uVar37 = SUB84((double)*(float *)UsrDat[lVar28],0);
              pcVar34 = "%.9g";
              goto LAB_0010d64e;
            case 9:
              __stream = *(FILE **)(MshIdx + 0x300410);
              uVar37 = (undefined4)*(undefined8 *)UsrDat[lVar28];
              pcVar34 = "%.17g";
LAB_0010d64e:
              fprintf(__stream,pcVar34,uVar37);
              break;
            case 10:
              fprintf(*(FILE **)(MshIdx + 0x300410),"%d",(ulong)*(uint *)UsrDat[lVar28]);
              break;
            case 0xb:
              fprintf(*(FILE **)(MshIdx + 0x300410),"%lld",*(undefined8 *)UsrDat[lVar28]);
            }
            iVar7 = 10;
            if (lVar28 < (long)*(int *)(lVar2 + 0x11c) + -1) {
              iVar7 = 0x20;
            }
            fputc(iVar7,*(FILE **)(MshIdx + 0x300410));
            if (pvVar33 == (void *)0x0) {
              uVar12 = uVar10;
              if (pvVar32 != (void *)0x0) {
                uVar12 = *(ulong *)((long)pvVar32 + uVar10 * 8);
              }
            }
            else {
              uVar12 = (long)*(int *)((long)pvVar33 + uVar10 * 4);
            }
            UsrDat[lVar28] = UsrBas[lVar28] + uVar12 * UsrLen[lVar28];
          }
        }
      }
      iVar27 = 1;
    }
  }
  return iVar27;
}

Assistant:

int GmfSetBlock(  int64_t MshIdx, int KwdCod, int64_t BegIdx, int64_t EndIdx,
                  int MapTyp, void *MapTab, void *prc, ... )
{
   char        *UsrDat[ GmfMaxTyp ], *UsrBas[ GmfMaxTyp ];
   char        *StrTab[4] = {"%.9g", "%.17g", "%d", "%lld" }, *FilPos;
   char        *FilBuf = NULL, *FrtBuf = NULL, *BckBuf = NULL;
   char        **BegTab, **EndTab, *BegUsrDat, *EndUsrDat;
   int         i, j, *FilPtrI32, *UsrPtrI32, FilTyp[ GmfMaxTyp ];
   int         UsrTyp[ GmfMaxTyp ], TypSiz[4] = {4,8,4,8};
   int         err, *IntMapTab = NULL, typ, mod = GmfArgLst;
   int         *TypTab, *SizTab, IniFlg = 1, TotSiz = 0, VecCnt, ArgCnt = 0;
   float       *FilPtrR32, *UsrPtrR32;
   double      *FilPtrR64, *UsrPtrR64;
   int64_t     UsrNmbLin, BlkNmbLin = 0, BlkBegIdx, BlkEndIdx = 0;
   int64_t     *FilPtrI64, *UsrPtrI64, *LngMapTab = NULL, OldIdx = 0;
   size_t      FilBegIdx = BegIdx, FilEndIdx = EndIdx;
   void        (*UsrPrc)(int64_t, int64_t, void *) = NULL;
   size_t      UsrLen[ GmfMaxTyp ], ret, LinSiz, VecLen, s, b, NmbBlk;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];
   struct      aiocb aio;
   char        *UsrArg = NULL;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(FilBuf)
         free(FilBuf);

      return(0);
   }

   // Check mesh and keyword
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) || !kwd->NmbLin )
      return(0);

   // Make sure it's not a simple information keyword
   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      return(0);

   // Temporarily overwright the given begin and end values
   // as arbitrary position block write is not yet implemented
   FilBegIdx = 1;
   FilEndIdx = kwd->NmbLin;

   // Check user's bounds
   if( (FilBegIdx < 1) || (FilBegIdx > FilEndIdx) || (FilEndIdx > (size_t)kwd->NmbLin) )
      return(0);

   // Compute the number of lines to be written
   UsrNmbLin = FilEndIdx - FilBegIdx + 1;

   // Get the renumbering map if any
   if(MapTyp == GmfInt)
      IntMapTab = (int *)MapTab;
   else if(MapTyp == GmfLong)
      LngMapTab = (int64_t *)MapTab;

   // Start decoding the arguments
   va_start(VarArg, prc);
   LinSiz = 0;

   // Get the user's postprocessing procedure and argument adresses, if any
   if(prc)
   {
      UsrPrc = (void (*)(int64_t, int64_t, void *))prc;
      UsrArg = va_arg(VarArg, void *);
   }

   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      longjmp(msh->err, -42);

   // Read the first data type to select between list and table mode
   typ = va_arg(VarArg, int);

   // If the table mode is selected, read the four additional tables
   // containing the arguments: type, vector size, begin and end pointers
   if(typ == GmfArgTab)
   {
      mod = GmfArgTab;
      TypTab = va_arg(VarArg, int *);
      SizTab = va_arg(VarArg, int *);
      BegTab = va_arg(VarArg, char **);
      EndTab = va_arg(VarArg, char **);
   }

   // Read the arguments until to total size reaches the keyword's size
   while(TotSiz < kwd->SolSiz)
   {
      // In list mode all arguments are read from the variable argument buffer
      if(mod == GmfArgLst)
      {
         // Do not read the type argument for the first iteration because
         // it was read befeore the loop begins to get the argument mode
         if(IniFlg)
            IniFlg = 0;
         else
            typ = va_arg(VarArg, int);

         // In case the type is a vector. get its size and change the type
         // for the corresponding scalar type
         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = va_arg(VarArg, int);
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            //  to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = va_arg(VarArg, char *);
         EndUsrDat = va_arg(VarArg, char *);
      }
      else
      {
         // Do exactly the same as above but the arguments are read from
         // the tables instead of VarArgs
         typ = TypTab[ ArgCnt ];

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = SizTab[ ArgCnt ];
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            // to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = (char *)BegTab[ ArgCnt ];
         EndUsrDat = (char *)EndTab[ ArgCnt ];
         ArgCnt++;
      }

      if(UsrNmbLin > 1)
      {
         VecLen = EndUsrDat - BegUsrDat;
         VecLen /= UsrNmbLin - 1;
      }
      else
         VecLen = 0;

      // Compute the consecutive begin / end adresses for vector data types
      for(i=0;i<VecCnt;i++)
      {
         UsrTyp[ TotSiz ]  = typ;
         UsrBas[ TotSiz ]  = BegUsrDat + i * TypSiz[ typ - GmfFloat ];
         UsrDat[ TotSiz ]  = UsrBas[ TotSiz ];
         UsrLen[ TotSiz ]  = VecLen;
         TotSiz++;
      }
   }

   // Get the file's data type
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
         if(msh->FltSiz == 32)
            FilTyp[i] = GmfFloat;
         else
            FilTyp[i] = GmfDouble;
      else
         if(msh->ver <= 3)
            FilTyp[i] = GmfInt;
         else
            FilTyp[i] = GmfLong;

      // Compute the file stride
      LinSiz += TypSiz[ FilTyp[i] - GmfFloat ];
   }

   va_end(VarArg);

   // Write the whole kwd data
   if(msh->typ & Asc)
   {
      if(UsrPrc)
         UsrPrc(1, kwd->NmbLin, UsrArg);

      for(s=FilBegIdx; s<=FilEndIdx; s++)
         for(j=0;j<kwd->SolSiz;j++)
         {
            if(UsrTyp[j] == GmfFloat)
            {
               UsrPtrR32 = (float *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], (double)*UsrPtrR32);
            }
            else if(UsrTyp[j] == GmfDouble)
            {
               UsrPtrR64 = (double *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrR64);
            }
            else if(UsrTyp[j] == GmfInt)
            {
               UsrPtrI32 = (int *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrI32);
            }
            else if(UsrTyp[j] == GmfLong)
            {
               UsrPtrI64 = (int64_t *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrI64);
            }

            if(j < kwd->SolSiz -1)
               fprintf(msh->hdl, " ");
            else
               fprintf(msh->hdl, "\n");

            //UsrDat[j] += UsrLen[j];
            if(IntMapTab)
               UsrDat[j] = UsrBas[j] + IntMapTab[s] * UsrLen[j];
            else if(LngMapTab)
               UsrDat[j] = UsrBas[j] + LngMapTab[s] * UsrLen[j];
            else
               UsrDat[j] = UsrBas[j] + s * UsrLen[j];
         }
   }
   else
   {
      // Allocate the front and back buffers
      if(!(BckBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -43);

      if(!(FrtBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -44);

      // Setup the asynchronous parameters
      memset(&aio, 0, sizeof(struct aiocb));
      FilBuf = BckBuf;
#ifdef WITH_GMF_AIO
      aio.aio_fildes = msh->FilDes;
#else
      aio.aio_fildes = msh->hdl;
#endif
      aio.aio_offset = (size_t)GetFilPos(msh);

      NmbBlk = UsrNmbLin / BufSiz;

      // Loop over N+1 blocks
      for(b=0;b<=NmbBlk+1;b++)
      {
         // Launch an asynchronous block write
         // except for the first loop iteration
         if(b)
         {
            aio.aio_nbytes = BlkNmbLin * LinSiz;
            
            if(my_aio_write(&aio) == -1)
            {
#ifdef WITH_GMF_AIO
               printf("aio_fildes = %d\n",aio.aio_fildes);
#else
               printf("aio_fildes = %p\n",aio.aio_fildes);
#endif
               printf("aio_buf    = %p\n",aio.aio_buf);
               printf("aio_offset = " INT64_T_FMT "\n",(int64_t)aio.aio_offset);
               printf("aio_nbytes = " INT64_T_FMT "\n",(int64_t)aio.aio_nbytes);
               printf("errno      = %d\n",errno);
               longjmp(msh->err, -45);
            }
         }

         // Parse the block data except at the last loop iteration
         if(b<=NmbBlk)
         {
            // The last block is shorter
            if(b == NmbBlk)
               BlkNmbLin = UsrNmbLin - b * BufSiz;
            else
               BlkNmbLin = BufSiz;

            FilPos = FilBuf;
            BlkBegIdx = BlkEndIdx+1;
            BlkEndIdx += BlkNmbLin;

            // Call user's preprocessing first
            if(UsrPrc)
               UsrPrc(BlkBegIdx, BlkEndIdx, UsrArg);

            // Then copy it's data to the file buffer
            for(i=0;i<BlkNmbLin;i++)
            {
               OldIdx++;

               for(j=0;j<kwd->SolSiz;j++)
               {
                  if(IntMapTab)
                     UsrDat[j] = UsrBas[j] + (IntMapTab[ OldIdx ] - 1) * UsrLen[j];
                  else if(LngMapTab)
                     UsrDat[j] = UsrBas[j] + (LngMapTab[ OldIdx ] - 1) * UsrLen[j];
                  else
                     UsrDat[j] = UsrBas[j] + (OldIdx - 1) * UsrLen[j];

                  if(FilTyp[j] == GmfInt)
                  {
                     FilPtrI32 = (int *)FilPos;

                     if(UsrTyp[j] == GmfInt)
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *FilPtrI32 = *UsrPtrI32;
                     }
                     else
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *FilPtrI32 = (int)*UsrPtrI64;
                     }
                  }
                  else if(FilTyp[j] == GmfLong)
                  {
                     FilPtrI64 = (int64_t *)FilPos;

                     if(UsrTyp[j] == GmfLong)
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *FilPtrI64 = *UsrPtrI64;
                     }
                     else
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *FilPtrI64 = (int64_t)*UsrPtrI32;
                     }
                  }
                  else if(FilTyp[j] == GmfFloat)
                  {
                     FilPtrR32 = (float *)FilPos;

                     if(UsrTyp[j] == GmfFloat)
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *FilPtrR32 = *UsrPtrR32;
                     }
                     else
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *FilPtrR32 = (float)*UsrPtrR64;
                     }
                  }
                  else if(FilTyp[j] == GmfDouble)
                  {
                     FilPtrR64 = (double *)FilPos;

                     if(UsrTyp[j] == GmfDouble)
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *FilPtrR64 = *UsrPtrR64;
                     }
                     else
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *FilPtrR64 = (double)*UsrPtrR32;
                     }
                  }

                  FilPos += TypSiz[ FilTyp[j] - GmfFloat ];
               }
            }
         }

         // Wait for write completion execpt at the first loop iteration
         if(b)
         {
            while(my_aio_error(&aio) == EINPROGRESS);

            err = my_aio_error(&aio);
            ret = my_aio_return(&aio);

            if (err != 0) {
              printf (" Error at aio_error() : %s\n", strerror (err));
              longjmp(msh->err, -46);
            }

            if (ret != aio.aio_nbytes) {
              printf(" Error at aio_return()\n");
              longjmp(msh->err, -47);
            }

            // Move the write position
            aio.aio_offset += (size_t)aio.aio_nbytes;
         }

         // Swap the buffers
         if(FilBuf == BckBuf)
         {
            aio.aio_buf = BckBuf;
            FilBuf = FrtBuf;
         }
         else
         {
            aio.aio_buf = FrtBuf;
            FilBuf = BckBuf;
         }
      }

      SetFilPos(msh, aio.aio_offset);
      free(BckBuf);
      free(FrtBuf);
   }

   return(1);
}